

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

bool __thiscall CScript::HasValidOps(CScript *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  const_iterator end;
  CScript *pCVar4;
  long in_FS_OFFSET;
  bool bVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> item;
  opcodetype opcode;
  const_iterator it;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  opcodetype local_3c;
  const_iterator local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->super_CScriptBase)._size;
  uVar3 = uVar1 - 0x1d;
  local_38.ptr = (uchar *)(this->super_CScriptBase)._union.indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
    local_38.ptr = (uchar *)this;
  }
  pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    pCVar4 = this;
  }
  end.ptr = (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3);
  bVar5 = end.ptr <= local_38.ptr;
  if (!bVar5) {
    do {
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = GetScriptOp(&local_38,end,&local_3c,&local_58);
      if ((!bVar2 || OP_NOP10 < local_3c) ||
         (0x208 < (ulong)((long)local_58.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start))) {
        if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        break;
      }
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar1 = (this->super_CScriptBase)._size;
      uVar3 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar3 = uVar1;
      }
      pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar1 < 0x1d) {
        pCVar4 = this;
      }
      end.ptr = (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3);
      bVar5 = local_38.ptr >= end.ptr;
    } while (local_38.ptr < end.ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::HasValidOps() const
{
    CScript::const_iterator it = begin();
    while (it < end()) {
        opcodetype opcode;
        std::vector<unsigned char> item;
        if (!GetOp(it, opcode, item) || opcode > MAX_OPCODE || item.size() > MAX_SCRIPT_ELEMENT_SIZE) {
            return false;
        }
    }
    return true;
}